

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O0

void luaJIT_profile_start(lua_State *L,char *mode,luaJIT_profile_callback cb,void *data)

{
  bool bVar1;
  int iVar2;
  void *in_RCX;
  luaJIT_profile_callback in_RDX;
  lua_State *in_RSI;
  long in_RDI;
  int m;
  int interval;
  ProfileState *ps;
  lj_profile_timer *in_stack_00000070;
  uint32_t local_3c;
  ProfileState *L_00;
  lua_State *L_01;
  
  L_00 = &profile_state;
  local_3c = 10;
  do {
    while( true ) {
      if ((char)(in_RSI->nextgc).gcptr32 == '\0') {
        if ((L_00->g == (global_State *)0x0) ||
           (luaJIT_profile_stop((lua_State *)L_00), L_00->g == (global_State *)0x0)) {
          L_00->g = (global_State *)(ulong)*(uint *)(in_RDI + 8);
          L_00->cb = in_RDX;
          L_00->data = in_RCX;
          L_00->samples = 0;
          (L_00->sb).L.ptr32 = (uint32_t)in_RDI;
          (L_00->sb).p.ptr32 = 0;
          (L_00->sb).e.ptr32 = 0;
          (L_00->sb).b.ptr32 = 0;
          (L_00->timer).opt.interval_msec = local_3c;
          (L_00->timer).opt.handler = profile_handler;
          lj_profile_timer_start(in_stack_00000070);
        }
        return;
      }
      L_01 = (lua_State *)((long)&(in_RSI->nextgc).gcptr32 + 1);
      iVar2 = (int)(char)(in_RSI->nextgc).gcptr32;
      if (iVar2 == 0x66) break;
      if (iVar2 == 0x69) {
        local_3c = 0;
        while( true ) {
          bVar1 = false;
          if ('/' < (char)(L_01->nextgc).gcptr32) {
            bVar1 = (char)(L_01->nextgc).gcptr32 < ':';
          }
          if (!bVar1) break;
          local_3c = local_3c * 10 + (char)(L_01->nextgc).gcptr32 + -0x30;
          L_01 = (lua_State *)((long)&(L_01->nextgc).gcptr32 + 1);
        }
        in_RSI = L_01;
        if ((int)local_3c < 1) {
          local_3c = 1;
        }
      }
      else {
        in_RSI = L_01;
        if (iVar2 == 0x6c) break;
      }
    }
    *(int *)((ulong)*(uint *)(in_RDI + 8) + 0xc64) = iVar2;
    lj_trace_flushall(L_01);
    in_RSI = L_01;
  } while( true );
}

Assistant:

LUA_API void luaJIT_profile_start(lua_State *L, const char *mode,
				  luaJIT_profile_callback cb, void *data)
{
  ProfileState *ps = &profile_state;
  int interval = LJ_PROFILE_INTERVAL_DEFAULT;
  while (*mode) {
    int m = *mode++;
    switch (m) {
    case 'i':
      interval = 0;
      while (*mode >= '0' && *mode <= '9')
	interval = interval * 10 + (*mode++ - '0');
      if (interval <= 0) interval = 1;
      break;
#if LJ_HASJIT
    case 'l': case 'f':
      L2J(L)->prof_mode = m;
      lj_trace_flushall(L);
      break;
#endif
    default:  /* Ignore unknown mode chars. */
      break;
    }
  }
  if (ps->g) {
    luaJIT_profile_stop(L);
    if (ps->g) return;  /* Profiler in use by another VM. */
  }
  ps->g = G(L);
  ps->cb = cb;
  ps->data = data;
  ps->samples = 0;
  lj_buf_init(L, &ps->sb);
  ps->timer.opt.interval_msec = interval;
  ps->timer.opt.handler = profile_handler;
  lj_profile_timer_start(&ps->timer);
}